

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

int evthread_is_debug_lock_held_(void *lock_)

{
  unsigned_long uVar1;
  int iVar2;
  
  iVar2 = 0;
  if (*(int *)((long)lock_ + 0x10) != 0) {
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0) &&
       (uVar1 = (*evthread_id_fn_)(), *(unsigned_long *)((long)lock_ + 8) != uVar1)) {
      return 0;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
evthread_is_debug_lock_held_(void *lock_)
{
	struct debug_lock *lock = lock_;
	if (! lock->count)
		return 0;
	if (evthread_id_fn_) {
		unsigned long me = evthread_id_fn_();
		if (lock->held_by != me)
			return 0;
	}
	return 1;
}